

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

void __thiscall ftxui::anon_unknown_0::Text::~Text(Text *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Text_0011eb58;
  pcVar2 = (this->text_)._M_dataplus._M_p;
  paVar1 = &(this->text_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Node::~Node(&this->super_Node);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit Text(std::string text) : text_(std::move(text)) {}